

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

Resource res_getArrayItem_63(ResourceData *pResData,Resource array,int32_t indexR)

{
  uint uVar1;
  Resource RVar2;
  uint16_t *p_1;
  int32_t *p;
  uint32_t offset;
  int32_t indexR_local;
  Resource array_local;
  ResourceData *pResData_local;
  
  uVar1 = array & 0xfffffff;
  if (-1 < indexR) {
    if (array >> 0x1c == 8) {
      if ((uVar1 != 0) && (indexR < pResData->pRoot[uVar1])) {
        return (pResData->pRoot + uVar1)[indexR + 1];
      }
    }
    else if ((array >> 0x1c == 9) && (indexR < (int)(uint)pResData->p16BitUnits[uVar1])) {
      RVar2 = makeResourceFrom16(pResData,(uint)(pResData->p16BitUnits + uVar1)[indexR + 1]);
      return RVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getArrayItem(const ResourceData *pResData, Resource array, int32_t indexR) {
    uint32_t offset=RES_GET_OFFSET(array);
    if (indexR < 0) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(array)) {
    case URES_ARRAY: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            if(indexR<*p) {
                return (Resource)p[1+indexR];
            }
        }
        break;
    }
    case URES_ARRAY16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        if(indexR<*p) {
            return makeResourceFrom16(pResData, p[1+indexR]);
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}